

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.cc
# Opt level: O0

BIGNUM * get_params(BIGNUM *ret,BN_ULONG *words,size_t num_words)

{
  int iVar1;
  BIGNUM *local_30;
  BIGNUM *alloc;
  size_t num_words_local;
  BN_ULONG *words_local;
  BIGNUM *ret_local;
  
  local_30 = (BIGNUM *)0x0;
  words_local = (BN_ULONG *)ret;
  if ((ret == (BIGNUM *)0x0) &&
     (local_30 = BN_new(), words_local = (BN_ULONG *)local_30, local_30 == (BIGNUM *)0x0)) {
    ret_local = (BIGNUM *)0x0;
  }
  else {
    iVar1 = bn_set_words((BIGNUM *)words_local,words,num_words);
    if (iVar1 == 0) {
      BN_free(local_30);
      ret_local = (BIGNUM *)0x0;
    }
    else {
      ret_local = (BIGNUM *)words_local;
    }
  }
  return ret_local;
}

Assistant:

static BIGNUM *get_params(BIGNUM *ret, const BN_ULONG *words,
                          size_t num_words) {
  BIGNUM *alloc = NULL;
  if (ret == NULL) {
    alloc = BN_new();
    if (alloc == NULL) {
      return NULL;
    }
    ret = alloc;
  }

  if (!bn_set_words(ret, words, num_words)) {
    BN_free(alloc);
    return NULL;
  }

  return ret;
}